

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O3

int ffdhdu(fitsfile *fptr,int *hdutype,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  long lVar3;
  LONGLONG *pLVar4;
  int tmptype;
  long naxes [1];
  
  tmptype = 0;
  if (0 < *status) {
    return *status;
  }
  iVar1 = fptr->HDUposition;
  pFVar2 = fptr->Fptr;
  if (iVar1 != pFVar2->curhdu) {
    ffmahd(fptr,iVar1 + 1,(int *)0x0,status);
    pFVar2 = fptr->Fptr;
    iVar1 = pFVar2->curhdu;
  }
  if (iVar1 == 0) {
    pFVar2->headend = 0;
    pFVar2->nextkey = 0;
    ffphpr(fptr,1,8,0,naxes,0,1,1,status);
    pFVar2 = fptr->Fptr;
    if (0x167f < pFVar2->headstart[(long)pFVar2->curhdu + 1]) {
      iVar1 = ffdblk(fptr,(pFVar2->headstart[(long)pFVar2->curhdu + 1] - 0xb40U) / 0xb40,status);
      if (0 < iVar1) goto LAB_00120919;
      pFVar2 = fptr->Fptr;
    }
    pFVar2->datastart = -1;
    ffrdef(fptr,status);
  }
  else {
    iVar1 = ffdblk(fptr,(pFVar2->headstart[(long)iVar1 + 1] - pFVar2->headstart[iVar1]) / 0xb40,
                   status);
    if (0 < iVar1) goto LAB_00120919;
    pFVar2 = fptr->Fptr;
    lVar3 = (long)pFVar2->curhdu;
    iVar1 = pFVar2->maxhdu;
    if (pFVar2->curhdu < iVar1) {
      pLVar4 = pFVar2->headstart;
      do {
        pLVar4[lVar3 + 1] = pLVar4[lVar3 + 2];
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar1);
    }
    else {
      pLVar4 = pFVar2->headstart;
    }
    pLVar4[(long)iVar1 + 1] = 0;
    pFVar2->maxhdu = iVar1 + -1;
    iVar1 = ffrhdu(fptr,&tmptype,status);
    if (0 < iVar1) {
      *status = 0;
      ffcmsg();
      ffgext(fptr,fptr->Fptr->curhdu + -1,&tmptype,status);
    }
  }
  if (hdutype != (int *)0x0) {
    *hdutype = tmptype;
  }
LAB_00120919:
  return *status;
}

Assistant:

int ffdhdu(fitsfile *fptr,      /* I - FITS file pointer                   */
           int *hdutype,        /* O - type of the new CHDU after deletion */
           int *status)         /* IO - error status                       */
/*
  Delete the CHDU.  If the CHDU is the primary array, then replace the HDU
  with an empty primary array with no data.   Return the
  type of the new CHDU after the old CHDU is deleted.
*/
{
    int tmptype = 0;
    long nblocks, ii, naxes[1];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->curhdu == 0) /* replace primary array with null image */
    {
        /* ignore any existing keywords */
        (fptr->Fptr)->headend = 0;
        (fptr->Fptr)->nextkey = 0;

        /* write default primary array header */
        ffphpr(fptr,1,8,0,naxes,0,1,1,status);

        /* calc number of blocks to delete (leave just 1 block) */
        nblocks = (long) (( (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu + 1] - 
                2880 ) / 2880);

        /* ffdblk also updates the starting address of all following HDUs */
        if (nblocks > 0)
        {
            if (ffdblk(fptr, nblocks, status) > 0) /* delete the HDU */
                return(*status);
        }

        /* this might not be necessary, but is doesn't hurt */
        (fptr->Fptr)->datastart = DATA_UNDEFINED;

        ffrdef(fptr, status);  /* reinitialize the primary array */
    }
    else
    {

        /* calc number of blocks to delete */
        nblocks = (long) (( (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu + 1] - 
                (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] ) / 2880);

        /* ffdblk also updates the starting address of all following HDUs */
        if (ffdblk(fptr, nblocks, status) > 0) /* delete the HDU */
            return(*status);

        /* delete the CHDU from the list of HDUs */
        for (ii = (fptr->Fptr)->curhdu + 1; ii <= (fptr->Fptr)->maxhdu; ii++)
            (fptr->Fptr)->headstart[ii] = (fptr->Fptr)->headstart[ii + 1];

        (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] = 0;
        ((fptr->Fptr)->maxhdu)--; /* decrement the known number of HDUs */

        if (ffrhdu(fptr, &tmptype, status) > 0)  /* initialize next HDU */
        {
            /* failed (end of file?), so move back one HDU */
            *status = 0;
            ffcmsg();       /* clear extraneous error messages */
            ffgext(fptr, ((fptr->Fptr)->curhdu) - 1, &tmptype, status);
        }
    }

    if (hdutype)
       *hdutype = tmptype;

    return(*status);
}